

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::processInitCommand(CoreBroker *this,ActionMessage *cmd)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  bool bVar1;
  BrokerState BVar2;
  action_t aVar3;
  __int_type_conflict1 _Var4;
  int iVar5;
  BasicBrokerInfo *pBVar6;
  pointer pBVar7;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  undefined1 in_stack_00000030 [16];
  MessageProcessingResult res;
  BasicBrokerInfo *brk_1;
  CoreBroker *in_stack_000000b8;
  ActionMessage grant;
  BasicBrokerInfo *brk;
  CoreBroker *in_stack_000005a0;
  undefined1 in_stack_0000072f;
  CoreBroker *in_stack_00000730;
  GlobalFederateId *in_stack_fffffffffffffd88;
  ActionMessage *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  BrokerBase *in_stack_fffffffffffffd98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffda0;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  ActionMessage *in_stack_fffffffffffffda8;
  CoreBroker *in_stack_fffffffffffffdb0;
  CoreBroker *in_stack_fffffffffffffdb8;
  GlobalBrokerId brokerid;
  CoreBroker *in_stack_fffffffffffffdc0;
  GlobalFederateId local_218 [4];
  ActionMessage *local_208;
  __sv_type local_200;
  BaseType local_1ec;
  GlobalFederateId local_1e8;
  BaseType local_1e4;
  undefined4 local_1d4;
  __sv_type local_1c0;
  BaseType local_1ac;
  GlobalFederateId local_1a8;
  undefined4 local_1a4;
  BaseType local_1a0;
  GlobalFederateId local_19c [5];
  __sv_type local_188;
  BaseType local_178;
  GlobalFederateId local_174 [9];
  __sv_type local_150;
  BaseType local_130;
  GlobalFederateId local_12c [3];
  ActionMessage *local_120;
  undefined1 in_stack_fffffffffffffeeb;
  int in_stack_fffffffffffffeec;
  BrokerBase *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  GlobalBrokerId in_stack_fffffffffffffefc;
  GlobalFederateId in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  GlobalFederateId in_stack_ffffffffffffff0c;
  GlobalFederateId local_dc;
  ActionMessage local_d8;
  BaseType local_1c;
  BasicBrokerInfo *local_18;
  ActionMessage *local_10;
  
  local_10 = in_RSI;
  aVar3 = ActionMessage::action(in_RSI);
  if (aVar3 == cmd_init) {
    local_1c = (BaseType)
               GlobalFederateId::operator_cast_to_GlobalBrokerId(in_stack_fffffffffffffd88);
    local_18 = getBrokerById(in_stack_fffffffffffffdb0,
                             (GlobalBrokerId)(BaseType)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    if (local_18 != (BasicBrokerInfo *)0x0) {
      if (local_18->state == CONNECTED) {
        local_18->state = INIT_REQUESTED;
      }
      if (((((in_RDI->super_BrokerBase).dynamicFederation & 1U) == 0) &&
          ((local_18->_observer & 1U) == 0)) ||
         (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x5fcad8), BVar2 < OPERATING)) {
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_10,iteration_requested_flag);
        if (bVar1) {
          local_18->initIterating = true;
          (in_RDI->super_BrokerBase).field_0x296 = 1;
        }
        bVar1 = allInitReady(in_stack_fffffffffffffdb8);
        if (bVar1) {
          if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
            _Var4 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffd98);
            if (0xe < _Var4) {
              local_178 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
              GlobalFederateId::GlobalFederateId(local_174,(GlobalBrokerId)local_178);
              getIdentifier_abi_cxx11_(in_RDI);
              local_188 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffd90);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
              name_01._M_len._4_4_ = in_stack_fffffffffffffefc.gid;
              name_01._M_len._0_4_ = in_stack_fffffffffffffef8;
              name_01._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
              name_01._M_str._4_4_ = in_stack_ffffffffffffff04;
              BrokerBase::sendToLogger
                        (in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,
                         in_stack_fffffffffffffeec,name_01,(string_view)in_stack_00000030,
                         (bool)in_stack_fffffffffffffeeb);
            }
            checkDependencies(in_stack_000005a0);
            local_1a0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
            GlobalFederateId::GlobalFederateId(local_19c,(GlobalBrokerId)local_1a0);
            (local_10->source_id).gid = local_19c[0].gid;
            if (((in_RDI->super_BrokerBase).field_0x296 & 1) != 0) {
              setActionFlag<helics::ActionMessage,helics::TimingFlags>
                        (local_10,iteration_requested_flag);
            }
            local_1a4 = 0;
            (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_10);
          }
          else if (((in_RDI->super_BrokerBase).field_0x296 & 1) == 0) {
            _Var4 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffd98);
            if (0xe < _Var4) {
              in_stack_fffffffffffffefc.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
              GlobalFederateId::GlobalFederateId
                        ((GlobalFederateId *)&stack0xffffffffffffff00,in_stack_fffffffffffffefc);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
              name._M_len._4_4_ = in_stack_fffffffffffffefc.gid;
              name._M_len._0_4_ = in_stack_fffffffffffffef8;
              name._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
              name._M_str._4_4_ = in_stack_ffffffffffffff04;
              BrokerBase::sendToLogger
                        (in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,
                         in_stack_fffffffffffffeec,name,(string_view)in_stack_00000030,
                         (bool)in_stack_fffffffffffffeeb);
              in_stack_fffffffffffffd90 = local_120;
            }
            _Var4 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffd98);
            if (5 < _Var4) {
              local_130 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
              GlobalFederateId::GlobalFederateId(local_12c,(GlobalBrokerId)local_130);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
              generateFederationSummary_abi_cxx11_(in_stack_000000b8);
              local_150 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffffd90);
              name_00._M_len._4_4_ = in_stack_fffffffffffffefc.gid;
              name_00._M_len._0_4_ = in_stack_fffffffffffffef8;
              name_00._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
              name_00._M_str._4_4_ = in_stack_ffffffffffffff04;
              this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_150._M_str;
              BrokerBase::sendToLogger
                        (in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,
                         in_stack_fffffffffffffeec,name_00,(string_view)in_stack_00000030,
                         (bool)in_stack_fffffffffffffeeb);
              std::__cxx11::string::~string(this_00);
            }
            executeInitializationOperations(in_stack_00000730,(bool)in_stack_0000072f);
          }
          else {
            executeInitializationOperations(in_stack_00000730,(bool)in_stack_0000072f);
          }
        }
      }
      else if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
        (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_10);
      }
      else {
        GlobalFederateId::GlobalFederateId
                  (&local_dc,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        ActionMessage::ActionMessage
                  (in_stack_fffffffffffffda8,(action_t)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                   (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                   (GlobalFederateId)(BaseType)in_stack_fffffffffffffdb0);
        bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                          (local_10,iteration_requested_flag);
        if (bVar1) {
          setActionFlag<helics::ActionMessage,helics::TimingFlags>
                    (&local_d8,iteration_requested_flag);
        }
        if ((local_18->_observer & 1U) == 0) {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_d8,dynamic_join_flag);
        }
        else {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>(&local_d8,observer_flag);
        }
        (*(in_RDI->super_Broker)._vptr_Broker[0x22])
                  (in_RDI,(ulong)(uint)(local_18->route).rid,&local_d8);
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd90);
      }
    }
  }
  else if (aVar3 == cmd_init_grant) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(local_10,observer_flag);
    if ((bVar1) ||
       (bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_10,dynamic_join_flag), bVar1)) {
      routeMessage(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    else {
      bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                        (local_10,iteration_requested_flag);
      if (bVar1) {
        executeInitializationOperations(in_stack_00000730,(bool)in_stack_0000072f);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
        if ((bVar1) &&
           (_Var4 = std::__atomic_base::operator_cast_to_int
                              ((__atomic_base<int> *)in_stack_fffffffffffffd98), 5 < _Var4)) {
          this_01 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->super_BrokerBase;
          local_1ec = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_1e8,(GlobalBrokerId)local_1ec);
          getIdentifier_abi_cxx11_(in_RDI);
          local_200 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffd90);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (this_01,(char *)in_stack_fffffffffffffd98);
          name_03._M_len._4_4_ = in_stack_fffffffffffffefc.gid;
          name_03._M_len._0_4_ = in_stack_fffffffffffffef8;
          name_03._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
          name_03._M_str._4_4_ = in_stack_ffffffffffffff04;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,in_stack_fffffffffffffeec,
                     name_03,(string_view)in_stack_00000030,(bool)in_stack_fffffffffffffeeb);
          in_stack_fffffffffffffd90 = local_208;
        }
        BrokerBase::setBrokerState
                  (in_stack_fffffffffffffd98,(BrokerState)((ulong)in_stack_fffffffffffffd90 >> 0x30)
                  );
        broadcast(in_stack_fffffffffffffdc0,(ActionMessage *)in_stack_fffffffffffffdb8);
        pBVar7 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5fd295);
        (*pBVar7->_vptr_BaseTimeCoordinator[10])();
        pBVar7 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x5fd2b5);
        memset(local_218,0,4);
        GlobalFederateId::GlobalFederateId(local_218);
        iVar5 = (*pBVar7->_vptr_BaseTimeCoordinator[9])(pBVar7,(ulong)(uint)local_218[0].gid);
        if ((char)iVar5 == '\0') {
          (in_RDI->super_BrokerBase).enteredExecutionMode = true;
        }
      }
    }
  }
  else if (aVar3 == cmd_init_not_ready) {
    bVar1 = allInitReady(in_stack_fffffffffffffdb8);
    brokerid.gid = (BaseType)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    if (bVar1) {
      if (((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) {
        local_1ac = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
        GlobalFederateId::GlobalFederateId(&local_1a8,(GlobalBrokerId)local_1ac);
        getIdentifier_abi_cxx11_(in_RDI);
        local_1c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffd90);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
        name_02._M_len._4_4_ = in_stack_fffffffffffffefc.gid;
        name_02._M_len._0_4_ = in_stack_fffffffffffffef8;
        name_02._M_str._0_4_ = in_stack_ffffffffffffff00.gid;
        name_02._M_str._4_4_ = in_stack_ffffffffffffff04;
        BrokerBase::sendToLogger
                  (in_stack_fffffffffffffef0,in_stack_ffffffffffffff0c,in_stack_fffffffffffffeec,
                   name_02,(string_view)in_stack_00000030,(bool)in_stack_fffffffffffffeeb);
        return;
      }
      local_1d4 = 0;
      (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_10);
    }
    local_1e4 = (BaseType)
                GlobalFederateId::operator_cast_to_GlobalBrokerId(in_stack_fffffffffffffd88);
    pBVar6 = getBrokerById(in_stack_fffffffffffffdb0,brokerid);
    if (pBVar6 != (BasicBrokerInfo *)0x0) {
      pBVar6->state = CONNECTED;
      pBVar6->initIterating = false;
    }
  }
  return;
}

Assistant:

void CoreBroker::processInitCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_INIT: {
            auto* brk = getBrokerById(static_cast<GlobalBrokerId>(cmd.source_id));

            if (brk == nullptr) {
                break;
            }
            if (brk->state == ConnectionState::CONNECTED) {
                brk->state = ConnectionState::INIT_REQUESTED;
            }

            if ((dynamicFederation || brk->_observer) &&
                getBrokerState() >= BrokerState::OPERATING) {
                if (isRootc) {
                    ActionMessage grant(CMD_INIT_GRANT, global_broker_id_local, cmd.source_id);
                    if (checkActionFlag(cmd, iteration_requested_flag)) {
                        setActionFlag(grant, iteration_requested_flag);
                    }
                    if (brk->_observer) {
                        setActionFlag(grant, observer_flag);
                    } else {
                        setActionFlag(grant, dynamic_join_flag);
                    }
                    transmit(brk->route, grant);
                } else {
                    transmit(parent_route_id, cmd);
                }
            } else {
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    brk->initIterating = true;
                    initIterating = true;
                }
                if (allInitReady()) {
                    if (isRootc) {
                        if (initIterating) {
                            executeInitializationOperations(true);
                        } else {
                            LOG_TIMING(global_broker_id_local,
                                       "root",
                                       "entering initialization mode");
                            LOG_SUMMARY(global_broker_id_local,
                                        "root",
                                        generateFederationSummary());
                            executeInitializationOperations(false);
                        }

                    } else {
                        LOG_TIMING(global_broker_id_local,
                                   getIdentifier(),
                                   "entering initialization mode");
                        checkDependencies();
                        cmd.source_id = global_broker_id_local;
                        if (initIterating) {
                            setActionFlag(cmd, iteration_requested_flag);
                        }
                        transmit(parent_route_id, cmd);
                    }
                }
            }

        } break;
        case CMD_INIT_NOT_READY: {
            if (allInitReady()) {
                if (isRootc) {
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "received init not ready but already init");
                    break;
                }
                transmit(parent_route_id, cmd);
            }
            auto* brk = getBrokerById(GlobalBrokerId{cmd.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::CONNECTED;
                brk->initIterating = false;
            }
        } break;
        case CMD_INIT_GRANT:
            if (!(checkActionFlag(cmd, observer_flag) || checkActionFlag(cmd, dynamic_join_flag))) {
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    executeInitializationOperations(true);
                } else {
                    if (brokerKey == universalKey) {
                        LOG_SUMMARY(global_broker_id_local,
                                    getIdentifier(),
                                    "Broker started with universal key");
                    }
                    setBrokerState(BrokerState::OPERATING);
                    broadcast(cmd);
                    timeCoord->enteringExecMode();
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                }
            } else {
                routeMessage(std::move(cmd));
            }
            break;
        default:
            break;
    }
}